

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall edition_unittest::Int32ParseTester::ByteSizeLong(Int32ParseTester *this)

{
  uint uVar1;
  int32_t iVar2;
  size_t sVar3;
  RepeatedField<int> *pRVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint32_t *puVar10;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  Int32ParseTester *this_;
  Int32ParseTester *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar4 = _internal_repeated_int32_lowfield(this);
  sVar5 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar4,1,&(this->field_0)._impl_._repeated_int32_lowfield_cached_byte_size_);
  pRVar4 = _internal_packed_int32_lowfield(this);
  sVar6 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar4,1,&(this->field_0)._impl_._packed_int32_lowfield_cached_byte_size_);
  pRVar4 = _internal_repeated_int32_midfield(this);
  sVar7 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar4,2,&(this->field_0)._impl_._repeated_int32_midfield_cached_byte_size_);
  pRVar4 = _internal_packed_int32_midfield(this);
  sVar8 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar4,2,&(this->field_0)._impl_._packed_int32_midfield_cached_byte_size_);
  pRVar4 = _internal_repeated_int32_hifield(this);
  sVar9 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar4,4,&(this->field_0)._impl_._repeated_int32_hifield_cached_byte_size_);
  pRVar4 = _internal_packed_int32_hifield(this);
  sStack_58 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                        (pRVar4,4,&(this->field_0)._impl_._packed_int32_hifield_cached_byte_size_);
  sStack_58 = sStack_58 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar3;
  puVar10 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0)
  ;
  uVar1 = *puVar10;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      iVar2 = _internal_optional_int32_lowfield(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar3 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      iVar2 = _internal_optional_int32_midfield(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar3 + 2 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      iVar2 = _internal_other_field(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar3 + 2 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      iVar2 = _internal_optional_int32_hifield(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_58 = sVar3 + 4 + sStack_58;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t Int32ParseTester::ByteSizeLong() const {
  const Int32ParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.Int32ParseTester)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32_lowfield = 2;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32_lowfield(), 1,
              this_._impl_._repeated_int32_lowfield_cached_byte_size_);
    }
    // repeated int32 packed_int32_lowfield = 3 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32_lowfield(), 1,
              this_._impl_._packed_int32_lowfield_cached_byte_size_);
    }
    // repeated int32 repeated_int32_midfield = 1002;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32_midfield(), 2,
              this_._impl_._repeated_int32_midfield_cached_byte_size_);
    }
    // repeated int32 packed_int32_midfield = 1003 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32_midfield(), 2,
              this_._impl_._packed_int32_midfield_cached_byte_size_);
    }
    // repeated int32 repeated_int32_hifield = 1000002;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32_hifield(), 4,
              this_._impl_._repeated_int32_hifield_cached_byte_size_);
    }
    // repeated int32 packed_int32_hifield = 1000003 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32_hifield(), 4,
              this_._impl_._packed_int32_hifield_cached_byte_size_);
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // int32 optional_int32_lowfield = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_optional_int32_lowfield());
    }
    // int32 optional_int32_midfield = 1001;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_optional_int32_midfield());
    }
    // int32 other_field = 99;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_other_field());
    }
    // int32 optional_int32_hifield = 1000001;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 4 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_optional_int32_hifield());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}